

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::anon_unknown_0::MaybeEmitHaswordsCheck
               (ChunkIterator it,ChunkIterator end,Options *options,
               vector<int,_std::allocator<int>_> *has_bit_indices,int cached_has_word_index,
               string *from,Printer *p)

{
  int iVar1;
  pointer ppFVar2;
  pointer piVar3;
  pointer ppFVar4;
  FieldDescriptor *pFVar5;
  Printer *pPVar6;
  bool bVar7;
  uint32_t uVar8;
  ulong uVar9;
  undefined8 *__dest;
  undefined8 *puVar10;
  FieldChunk *pFVar11;
  FieldDescriptor **ppFVar12;
  int iVar13;
  int iVar14;
  ChunkIterator end_00;
  ulong __n;
  ulong uVar15;
  vector<HasWordMask,_std::allocator<HasWordMask>_> hasword_masks;
  anon_class_1_0_00000001 local_149;
  undefined8 *local_148;
  undefined8 *puStack_140;
  undefined8 *local_138;
  int local_12c;
  vector<int,_std::allocator<int>_> *local_128;
  long *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  undefined8 *local_100;
  string *local_f8;
  ulong local_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [24];
  code *local_b0;
  byte local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 local_80;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_78;
  
  if ((((it._M_current)->has_hasbit == true) &&
      (local_12c = cached_has_word_index, local_f8 = from, bVar7 = IsProfileDriven(options),
      0x20 < (long)end._M_current - (long)it._M_current && bVar7)) &&
     ((it._M_current)->is_rarely_present == true)) {
    local_148 = (undefined8 *)0x0;
    puStack_140 = (undefined8 *)0x0;
    local_138 = (undefined8 *)0x0;
    if (it._M_current != end._M_current) {
      puVar10 = (undefined8 *)0x0;
      local_128 = has_bit_indices;
LAB_00265556:
      pFVar11 = it._M_current + 1;
      end_00._M_current = end._M_current;
      if (pFVar11 != end._M_current) {
        ppFVar2 = ((it._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((ppFVar2 !=
               ((it._M_current)->fields).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (ppFVar4 = (pFVar11->fields).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             ppFVar4 !=
             (pFVar11->fields).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            pFVar5 = *ppFVar2;
            if ((pFVar5->field_0x1 & 8) == 0) {
              ppFVar12 = &pFVar5->containing_type_->fields_;
            }
            else if ((pFVar5->scope_).extension_scope == (Descriptor *)0x0) {
              ppFVar12 = &pFVar5->file_->extensions_;
            }
            else {
              ppFVar12 = &((pFVar5->scope_).extension_scope)->extensions_;
            }
            iVar1 = piVar3[(int)((ulong)((long)pFVar5 - (long)*ppFVar12) >> 3) * -0x45d1745d];
            iVar13 = iVar1 + 0x1f;
            if (-1 < iVar1) {
              iVar13 = iVar1;
            }
            pFVar5 = *ppFVar4;
            if ((pFVar5->field_0x1 & 8) == 0) {
              ppFVar12 = &pFVar5->containing_type_->fields_;
            }
            else if ((pFVar5->scope_).extension_scope == (Descriptor *)0x0) {
              ppFVar12 = &pFVar5->file_->extensions_;
            }
            else {
              ppFVar12 = &((pFVar5->scope_).extension_scope)->extensions_;
            }
            iVar1 = piVar3[(int)((ulong)((long)pFVar5 - (long)*ppFVar12) >> 3) * -0x45d1745d];
            iVar14 = iVar1 + 0x1f;
            if (-1 < iVar1) {
              iVar14 = iVar1;
            }
            end_00._M_current = pFVar11;
            if (iVar13 >> 5 != iVar14 >> 5) break;
          }
          pFVar11 = pFVar11 + 1;
          end_00._M_current = end._M_current;
        } while (pFVar11 != end._M_current);
      }
      do {
        if (it._M_current == end_00._M_current) goto LAB_002657c2;
        ppFVar2 = ((it._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppFVar2 !=
            ((it._M_current)->fields).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pFVar5 = *ppFVar2;
          if ((pFVar5->field_0x1 & 8) == 0) {
            ppFVar12 = &pFVar5->containing_type_->fields_;
          }
          else if ((pFVar5->scope_).extension_scope == (Descriptor *)0x0) {
            ppFVar12 = &pFVar5->file_->extensions_;
          }
          else {
            ppFVar12 = &((pFVar5->scope_).extension_scope)->extensions_;
          }
          iVar1 = (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start
                  [(int)((ulong)((long)pFVar5 - (long)*ppFVar12) >> 3) * -0x45d1745d];
          iVar13 = iVar1 + 0x1f;
          if (-1 < iVar1) {
            iVar13 = iVar1;
          }
          uVar8 = GenChunkMask(it,end_00,has_bit_indices);
          if (puStack_140 == local_138) {
            __n = (long)puStack_140 - (long)local_148;
            if (__n == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar15 = (long)__n >> 3;
            uVar9 = uVar15;
            if (puStack_140 == local_148) {
              uVar9 = 1;
            }
            local_f0 = uVar9 + uVar15;
            if (0xffffffffffffffe < local_f0) {
              local_f0 = 0xfffffffffffffff;
            }
            if (CARRY8(uVar9,uVar15)) {
              local_f0 = 0xfffffffffffffff;
            }
            if (local_f0 == 0) {
              __dest = (undefined8 *)0x0;
              puVar10 = local_148;
            }
            else {
              local_100 = local_148;
              __dest = (undefined8 *)operator_new(local_f0 * 8);
              puVar10 = local_100;
            }
            __dest[uVar15] = CONCAT44(uVar8,iVar13 >> 5);
            if (0 < (long)__n) {
              memmove(__dest,puVar10,__n);
            }
            has_bit_indices = local_128;
            if (puVar10 != (undefined8 *)0x0) {
              operator_delete(puVar10,__n);
            }
            puVar10 = (undefined8 *)(__n + 8 + (long)__dest);
            local_138 = __dest + local_f0;
            local_148 = __dest;
            puStack_140 = puVar10;
          }
          else {
            *puStack_140 = CONCAT44(uVar8,iVar13 >> 5);
            puVar10 = puStack_140 + 1;
            has_bit_indices = local_128;
            puStack_140 = puVar10;
          }
          goto LAB_002657c2;
        }
        it._M_current = it._M_current + 1;
      } while( true );
    }
  }
  return false;
LAB_002657c2:
  pPVar6 = p;
  it._M_current = end_00._M_current;
  if (end_00._M_current == end._M_current) {
    bVar7 = local_148 != puVar10;
    if (bVar7) {
      local_120 = (long *)&local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"cond","");
      local_e8 = &local_d8;
      if (local_120 == (long *)&local_110) {
        uStack_d0 = uStack_108;
      }
      else {
        local_e8 = local_120;
      }
      local_d8 = CONCAT71(uStack_10f,local_110);
      local_e0 = local_118;
      local_118 = 0;
      local_110 = 0;
      local_120 = (long *)&local_110;
      local_c8._0_8_ = operator_new(0x28);
      *(undefined8 ***)local_c8._0_8_ = &local_148;
      *(Printer ***)(local_c8._0_8_ + 8) = &p;
      *(int **)(local_c8._0_8_ + 0x10) = &local_12c;
      *(string **)(local_c8._0_8_ + 0x18) = local_f8;
      *(undefined1 *)(local_c8._0_8_ + 0x20) = 0;
      local_b0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      local_c8._8_8_ = 0;
      local_c8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_a8 = 1;
      local_98 = 0;
      local_90 = 0;
      local_80 = 0;
      local_a0 = &local_90;
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
      local_78._M_engaged = false;
      io::Printer::Emit(pPVar6,&local_e8,1,0x39,
                        "\n            if (ABSL_PREDICT_FALSE($cond$)) {\n          ");
      if (local_78._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_78);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_a8]._M_data)
                (&local_149,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_c8);
      local_a8 = 0xff;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_120 != (long *)&local_110) {
        operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
      }
      p->indent_ = p->indent_ + (p->options_).spaces_per_indent;
    }
    if (local_148 == (undefined8 *)0x0) {
      return bVar7;
    }
    operator_delete(local_148,(long)local_138 - (long)local_148);
    return bVar7;
  }
  goto LAB_00265556;
}

Assistant:

bool MaybeEmitHaswordsCheck(ChunkIterator it, ChunkIterator end,
                            const Options& options,
                            const std::vector<int>& has_bit_indices,
                            int cached_has_word_index, const std::string& from,
                            io::Printer* p) {
  if (!it->has_hasbit || !IsProfileDriven(options) ||
      std::distance(it, end) < 2 || !it->is_rarely_present) {
    return false;
  }

  auto hasbit_word = [&has_bit_indices](const FieldDescriptor* field) {
    return has_bit_indices[field->index()] / 32;
  };
  auto is_same_hasword = [&](const FieldChunk& a, const FieldChunk& b) {
    // Empty fields are assumed to have the same haswords.
    if (a.fields.empty() || b.fields.empty()) return true;

    return hasbit_word(a.fields.front()) == hasbit_word(b.fields.front());
  };

  struct HasWordMask {
    int word;
    uint32_t mask;
  };

  std::vector<HasWordMask> hasword_masks;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, is_same_hasword);
    for (; it != next; ++it) {
      if (!it->fields.empty()) {
        hasword_masks.push_back({hasbit_word(it->fields.front()),
                                 GenChunkMask(it, next, has_bit_indices)});
        break;
      }
    }
    // Jump to the next batch instead.
    it = next;
  }

  if (hasword_masks.empty()) return false;

  // Emit has_bit check for each has_bit_dword index.
  p->Emit({{"cond",
            [&] {
              int first_word = hasword_masks.front().word;
              for (const auto& m : hasword_masks) {
                uint32_t mask = m.mask;
                int this_word = m.word;
                if (this_word != first_word) {
                  p->Emit(R"cc(
                    ||
                  )cc");
                }
                auto v =
                    p->WithVars({{"mask", absl::StrFormat("0x%08xu", mask)}});
                if (this_word == cached_has_word_index) {
                  p->Emit("(cached_has_bits & $mask$) != 0");
                } else {
                  p->Emit({{"from", from}, {"word", this_word}},
                          "($from$_impl_._has_bits_[$word$] & $mask$) != 0");
                }
              }
            }}},
          R"cc(
            if (ABSL_PREDICT_FALSE($cond$)) {
          )cc");
  p->Indent();
  return true;
}